

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O2

void __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::WithinAbsMatcher
          (WithinAbsMatcher *this,string *msg,double target,double margin)

{
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2
  ;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinAbsMatcher_002b3430;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  this->m_target = target;
  this->m_margin = margin;
  return;
}

Assistant:

WithinAbsMatcher::WithinAbsMatcher(std::string msg, double target, double margin)
        :m_msg{msg}, m_target{ target }, m_margin{ margin } {
    }